

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_graph.h
# Opt level: O1

WeightedGraph<int,_int> * __thiscall
data_structures::WeightedGraph<int,_int>::addVertex(WeightedGraph<int,_int> *this,int *vertex)

{
  int iVar1;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar2;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar3;
  out_of_range *this_00;
  Node *v;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node_1;
  WeightedGraphAdjSet<int,_int> local_58;
  
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::add(&this->_tree,vertex);
  v = (this->_tree)._root;
  if (v != (Node *)0x0) {
    do {
      iVar1 = (v->element).key;
      if (iVar1 == *vertex) {
        WeightedGraphAdjSet<int,_int>::WeightedGraphAdjSet(&local_58,v);
        RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::set
                  (&this->_tree,vertex,&local_58);
        local_58._vptr_WeightedGraphAdjSet = (_func_int **)&PTR__WeightedGraphAdjSet_0010d988;
        local_58._table._vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010d9b8;
        while (pLVar3 = local_58._table._list._header,
              local_58._table._list._header != local_58._table._list._tail) {
          pLVar2 = (local_58._table._list._header)->_next;
          if (pLVar2 != (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                         *)0x0) {
            (local_58._table._list._header)->_next = pLVar2->_next;
            (*pLVar2->_vptr_ListNode[1])(pLVar2);
          }
          if (pLVar2 == local_58._table._list._tail) {
            local_58._table._list._tail = pLVar3;
          }
          local_58._table._list._size = local_58._table._list._size - 1;
        }
        local_58._table._list._size = 0;
        local_58._table._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010d9e8;
        if (local_58._table._list._header !=
            (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
             *)0x0) {
          (*(local_58._table._list._header)->_vptr_ListNode[1])(local_58._table._list._header);
        }
        return this;
      }
      v = (&v->_left)[iVar1 <= *vertex];
    } while (v != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                   *)0x0);
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Key error, no such key in this tree !");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

inline
    WeightedGraph<T, Weight>& WeightedGraph<T, Weight>::addVertex(const T &vertex){
        _tree.add(vertex);
        _tree.set(vertex, WeightedGraphAdjSet<T, Weight>(_tree.getNode(vertex)));
        return *this;
    }